

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_layer.c
# Opt level: O1

void dropout_layer_backward(layer_t *l)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  data_val_t *pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  lVar5 = (long)l->n->batch;
  if (0 < lVar5) {
    uVar3 = (l->in).size;
    lVar6 = 0;
    lVar7 = 0;
    do {
      if (0 < (int)uVar3) {
        pdVar4 = (l->extra).val;
        uVar9 = 0;
        lVar8 = lVar6;
        do {
          fVar2 = *(float *)&l[1].func;
          pfVar1 = pdVar4 + uVar9;
          if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
            *(float *)((long)(l->in).grad + lVar8) =
                 *(float *)((long)(l->out).grad + lVar8) / (1.0 - fVar2);
          }
          else {
            *(undefined4 *)((long)(l->in).grad + lVar8) = 0;
          }
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 4;
        } while (uVar3 != uVar9);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + (ulong)uVar3 * 4;
    } while (lVar7 != lVar5);
  }
  return;
}

Assistant:

static void dropout_layer_backward(layer_t *l)
{
	int i = 0, b = 0;
	dropout_layer_t *drop = (dropout_layer_t *)l;

	for (b = 0; b < l->n->batch; ++b)
		for (i = 0; i < l->in.size; ++i)
		{
			if (l->extra.val[i] < drop->prob)
				l->in.grad[b * l->in.size + i] = 0;
			else
				l->in.grad[b * l->in.size + i] = l->out.grad[b * l->in.size + i] / (1 - drop->prob);
		}
}